

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

longdouble * csv::internals::pow10<long_double>(longdouble *__return_storage_ptr__,longdouble *n)

{
  unkbyte10 local_64;
  undefined1 auStack_58 [8];
  longdouble i;
  longdouble iterations;
  longdouble ret;
  longdouble multiplicand;
  longdouble *n_local;
  
  if (*__return_storage_ptr__ <= (longdouble)0) {
    local_64 = -*__return_storage_ptr__;
  }
  else {
    local_64 = *__return_storage_ptr__;
  }
  for (_auStack_58 = (longdouble)0; _auStack_58 < local_64;
      _auStack_58 = (longdouble)1 + _auStack_58) {
  }
  return __return_storage_ptr__;
}

Assistant:

HEDLEY_CONST CONSTEXPR_14
        long double pow10(const T& n) noexcept {
            long double multiplicand = n > 0 ? 10 : 0.1,
                ret = 1;

            // Make all numbers positive
            T iterations = n > 0 ? n : -n;
            
            for (T i = 0; i < iterations; i++) {
                ret *= multiplicand;
            }

            return ret;
        }